

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

int google::protobuf::CEscapeInternal
              (char *src,int src_len,char *dest,int dest_len,bool use_hex,bool utf8_safe)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  char *__format;
  byte local_3e;
  byte local_3d;
  int local_3c;
  bool is_hex_escape;
  bool last_hex_escape;
  int used;
  char *src_end;
  bool utf8_safe_local;
  bool use_hex_local;
  int dest_len_local;
  char *dest_local;
  byte *pbStack_18;
  int src_len_local;
  char *src_local;
  
  local_3c = 0;
  local_3d = 0;
  pbStack_18 = (byte *)src;
  while( true ) {
    if (src + src_len <= pbStack_18) {
      if (dest_len - local_3c < 1) {
        src_local._4_4_ = -1;
      }
      else {
        dest[local_3c] = '\0';
        src_local._4_4_ = local_3c;
      }
      return src_local._4_4_;
    }
    if (dest_len - local_3c < 2) break;
    local_3e = 0;
    bVar1 = *pbStack_18;
    if (bVar1 == 9) {
      iVar3 = local_3c + 1;
      dest[local_3c] = '\\';
      local_3c = local_3c + 2;
      dest[iVar3] = 't';
    }
    else if (bVar1 == 10) {
      iVar3 = local_3c + 1;
      dest[local_3c] = '\\';
      local_3c = local_3c + 2;
      dest[iVar3] = 'n';
    }
    else if (bVar1 == 0xd) {
      iVar3 = local_3c + 1;
      dest[local_3c] = '\\';
      local_3c = local_3c + 2;
      dest[iVar3] = 'r';
    }
    else if (bVar1 == 0x22) {
      iVar3 = local_3c + 1;
      dest[local_3c] = '\\';
      local_3c = local_3c + 2;
      dest[iVar3] = '\"';
    }
    else if (bVar1 == 0x27) {
      iVar3 = local_3c + 1;
      dest[local_3c] = '\\';
      local_3c = local_3c + 2;
      dest[iVar3] = '\'';
    }
    else if (bVar1 == 0x5c) {
      iVar3 = local_3c + 1;
      dest[local_3c] = '\\';
      local_3c = local_3c + 2;
      dest[iVar3] = '\\';
    }
    else if (((utf8_safe) && (0x7f < *pbStack_18)) ||
            ((uVar2 = isprint((int)(char)*pbStack_18), (uVar2 & 1) != 0 &&
             ((local_3d == 0 || (uVar2 = isxdigit((int)(char)*pbStack_18), (uVar2 & 1) == 0)))))) {
      dest[local_3c] = *pbStack_18;
      local_3c = local_3c + 1;
    }
    else {
      if (dest_len - local_3c < 4) {
        return -1;
      }
      __format = "\\%03o";
      if (use_hex) {
        __format = "\\x%02x";
      }
      sprintf(dest + local_3c,__format,(ulong)*pbStack_18);
      local_3e = use_hex;
      local_3c = local_3c + 4;
    }
    local_3d = local_3e & 1;
    pbStack_18 = pbStack_18 + 1;
  }
  return -1;
}

Assistant:

int CEscapeInternal(const char* src, int src_len, char* dest,
                    int dest_len, bool use_hex, bool utf8_safe) {
  const char* src_end = src + src_len;
  int used = 0;
  bool last_hex_escape = false; // true if last output char was \xNN

  for (; src < src_end; src++) {
    if (dest_len - used < 2)   // Need space for two letter escape
      return -1;

    bool is_hex_escape = false;
    switch (*src) {
      case '\n': dest[used++] = '\\'; dest[used++] = 'n';  break;
      case '\r': dest[used++] = '\\'; dest[used++] = 'r';  break;
      case '\t': dest[used++] = '\\'; dest[used++] = 't';  break;
      case '\"': dest[used++] = '\\'; dest[used++] = '\"'; break;
      case '\'': dest[used++] = '\\'; dest[used++] = '\''; break;
      case '\\': dest[used++] = '\\'; dest[used++] = '\\'; break;
      default:
        // Note that if we emit \xNN and the src character after that is a hex
        // digit then that digit must be escaped too to prevent it being
        // interpreted as part of the character code by C.
        if ((!utf8_safe || static_cast<uint8>(*src) < 0x80) &&
            (!isprint(*src) ||
             (last_hex_escape && isxdigit(*src)))) {
          if (dest_len - used < 4) // need space for 4 letter escape
            return -1;
          sprintf(dest + used, (use_hex ? "\\x%02x" : "\\%03o"),
                  static_cast<uint8>(*src));
          is_hex_escape = use_hex;
          used += 4;
        } else {
          dest[used++] = *src; break;
        }
    }
    last_hex_escape = is_hex_escape;
  }

  if (dest_len - used < 1)   // make sure that there is room for \0
    return -1;

  dest[used] = '\0';   // doesn't count towards return value though
  return used;
}